

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QInputMethodQueryEvent::QueryPair>::
emplace<QInputMethodQueryEvent::QueryPair_const&>
          (QMovableArrayOps<QInputMethodQueryEvent::QueryPair> *this,qsizetype i,QueryPair *args)

{
  QueryPair **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QueryPair *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QueryPair tmp;
  Inserter local_80;
  InputMethodQuery local_58;
  undefined4 uStack_54;
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
           super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002ccd34:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    aStack_50._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_50._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_50.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    _local_58 = CONCAT44(0xaaaaaaaa,args->query);
    ::QVariant::QVariant((QVariant *)&aStack_50,&args->value);
    bVar6 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
            super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size != 0;
    QArrayDataPointer<QInputMethodQueryEvent::QueryPair>::detachAndGrow
              ((QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this,(uint)(i == 0 && bVar6),
               1,(QueryPair **)0x0,(QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)0x0);
    if (i == 0 && bVar6) {
      pQVar5 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
               super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      pQVar5[-1].query = local_58;
      *(undefined8 *)((long)&pQVar5[-1].value.d.data + 0x10) = aStack_50._16_8_;
      *(undefined1 **)&pQVar5[-1].value.d.field_0x18 = local_38;
      pQVar5[-1].value.d.data.shared = aStack_50.shared;
      *(undefined8 *)((long)&pQVar5[-1].value.d.data + 8) = aStack_50._8_8_;
      aStack_50.shared = (PrivateShared *)0x0;
      aStack_50._8_8_ = 0;
      aStack_50._16_8_ = 0;
      local_38 = (undefined1 *)0x2;
      ppQVar1 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_80.displaceTo =
           (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
           super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      local_80.displaceFrom = local_80.displaceTo + i;
      local_80.displaceTo = local_80.displaceTo + i + 1;
      local_80.nInserts = 1;
      local_80.bytes =
           ((this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
            super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size - i) * 0x28;
      local_80.data = (QArrayDataPointer<QInputMethodQueryEvent::QueryPair> *)this;
      memmove(local_80.displaceTo,local_80.displaceFrom,local_80.bytes);
      (local_80.displaceFrom)->query = local_58;
      *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 0x10) = aStack_50._16_8_;
      *(undefined1 **)&((local_80.displaceFrom)->value).d.field_0x18 = local_38;
      ((local_80.displaceFrom)->value).d.data.shared = aStack_50.shared;
      *(undefined8 *)((long)&((local_80.displaceFrom)->value).d.data + 8) = aStack_50._8_8_;
      aStack_50.shared = (PrivateShared *)0x0;
      aStack_50._8_8_ = 0;
      aStack_50._16_8_ = 0;
      local_38 = (undefined1 *)0x2;
      local_80.displaceFrom = local_80.displaceFrom + 1;
      Inserter::~Inserter(&local_80);
    }
    ::QVariant::~QVariant((QVariant *)&aStack_50);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
            super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                      super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pQVar5 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
               super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr + lVar4;
      pQVar5->query = args->query;
      ::QVariant::QVariant(&pQVar5->value,&args->value);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QueryPair *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
             super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr)) goto LAB_002ccd34;
      pQVar5 = (this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
               super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      pQVar5[-1].query = args->query;
      ::QVariant::QVariant(&pQVar5[-1].value,&args->value);
      ppQVar1 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
                 super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QInputMethodQueryEvent::QueryPair>).
              super_QArrayDataPointer<QInputMethodQueryEvent::QueryPair>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }